

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O0

PSpriteAmiga __thiscall
DataSourceAmiga::make_shadow_from_symbol(DataSourceAmiga *this,PSpriteAmiga *symbol)

{
  element_type *peVar1;
  shared_ptr<DataSourceAmiga::SpriteAmiga> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PSpriteAmiga PVar2;
  shared_ptr<Data::Sprite> local_80;
  shared_ptr<Data::Sprite> local_70;
  shared_ptr<Data::Sprite> local_60 [2];
  shared_ptr<Data::Sprite> local_40;
  undefined4 local_2c;
  int local_28;
  undefined1 local_21;
  PSpriteAmiga *symbol_local;
  DataSourceAmiga *this_local;
  PSpriteAmiga *res;
  
  local_21 = 0;
  local_28 = 10;
  local_2c = 10;
  symbol_local = symbol;
  this_local = this;
  std::make_shared<DataSourceAmiga::SpriteAmiga,int,int>((int *)this,&local_28);
  peVar1 = std::
           __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<Data::Sprite>::shared_ptr<DataSourceAmiga::SpriteAmiga,void>(&local_40,in_RDX);
  (*(peVar1->super_SpriteBase).super_Sprite._vptr_Sprite[0xf])(peVar1,&local_40,1,0);
  std::shared_ptr<Data::Sprite>::~shared_ptr(&local_40);
  peVar1 = std::
           __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<Data::Sprite>::shared_ptr<DataSourceAmiga::SpriteAmiga,void>(local_60,in_RDX);
  (*(peVar1->super_SpriteBase).super_Sprite._vptr_Sprite[0xf])(peVar1,local_60,0,1);
  std::shared_ptr<Data::Sprite>::~shared_ptr(local_60);
  peVar1 = std::
           __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<Data::Sprite>::shared_ptr<DataSourceAmiga::SpriteAmiga,void>(&local_70,in_RDX);
  (*(peVar1->super_SpriteBase).super_Sprite._vptr_Sprite[0xf])(peVar1,&local_70,2,1);
  std::shared_ptr<Data::Sprite>::~shared_ptr(&local_70);
  peVar1 = std::
           __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  std::shared_ptr<Data::Sprite>::shared_ptr<DataSourceAmiga::SpriteAmiga,void>(&local_80,in_RDX);
  (*(peVar1->super_SpriteBase).super_Sprite._vptr_Sprite[0xf])(peVar1,&local_80,1,2);
  std::shared_ptr<Data::Sprite>::~shared_ptr(&local_80);
  peVar1 = std::
           __shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)this);
  (*(peVar1->super_SpriteBase).super_Sprite._vptr_Sprite[10])(peVar1,0xffffffff);
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::make_shadow_from_symbol(PSpriteAmiga symbol) {
  PSpriteAmiga res = std::make_shared<SpriteAmiga>(10, 10);
  res->stick(symbol, 1, 0);
  res->stick(symbol, 0, 1);
  res->stick(symbol, 2, 1);
  res->stick(symbol, 1, 2);
  res->fill_masked({0xFF, 0xFF, 0xFF, 0xFF});
  return res;
}